

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_apu.c
# Opt level: O3

void nes_apu_update(void *chip,UINT32 samples,DEV_SMPL **outputs)

{
  uint uVar1;
  DEV_SMPL *pDVar2;
  DEV_SMPL *pDVar3;
  uint uVar4;
  short sVar5;
  byte bVar6;
  uint uVar7;
  sbyte sVar8;
  byte bVar9;
  char cVar10;
  int iVar12;
  int iVar13;
  ulong uVar14;
  byte bVar15;
  uint uVar16;
  int iVar17;
  short sVar18;
  nesapu_state *info;
  float fVar19;
  byte bVar11;
  
  if (samples != 0) {
    pDVar2 = *outputs;
    pDVar3 = outputs[1];
    uVar14 = 0;
    do {
      apu_square((nesapu_state *)chip,(square_t *)((long)chip + 8));
      apu_square((nesapu_state *)chip,(square_t *)((long)chip + 0x30));
      if ((*(char *)((long)chip + 0x72) == '\x01') && (*(char *)((long)chip + 0x74) == '\0')) {
        bVar6 = *(byte *)((long)chip + 0x58);
        if (((char)bVar6 < '\0' || *(char *)((long)chip + 0x71) != '\0') ||
           ((*(int *)((long)chip + 0x68) != 0 &&
            (iVar12 = *(int *)((long)chip + 0x68) + -1, *(int *)((long)chip + 0x68) = iVar12,
            iVar12 != 0)))) {
          if (*(char *)((long)chip + 0x71) != '\0') goto LAB_0016173a;
          iVar12 = *(int *)((long)chip + 0x5c);
        }
        else {
          *(undefined1 *)((long)chip + 0x71) = 1;
LAB_0016173a:
          if (*(char *)((long)chip + 0x60) == '\x01') {
            iVar12 = *(int *)((long)chip + (ulong)(bVar6 & 0x7f) * 4 + 0x208);
LAB_0016175a:
            *(int *)((long)chip + 0x5c) = iVar12;
          }
          else {
            iVar12 = *(int *)((long)chip + 0x5c);
            if (0 < iVar12) {
              iVar12 = iVar12 + -1;
              goto LAB_0016175a;
            }
          }
          if (-1 < (char)bVar6) {
            *(undefined1 *)((long)chip + 0x60) = 0;
            if (*(int *)((long)chip + 100) != 0) {
              *(int *)((long)chip + 100) = *(int *)((long)chip + 100) + -1;
            }
          }
        }
        if ((iVar12 == 0) || (*(int *)((long)chip + 100) == 0)) {
LAB_00161795:
          cVar10 = '\0';
          goto LAB_00161797;
        }
        iVar12 = (*(byte *)((long)chip + 0x5b) & 7) * 0x100;
        if (iVar12 + (uint)*(byte *)((long)chip + 0x5a) < 3) goto LAB_00161795;
        fVar19 = *(float *)((long)chip + 0x6c) - *(float *)((long)chip + 0xfc);
        *(float *)((long)chip + 0x6c) = fVar19;
        if (fVar19 < 0.0) {
          bVar6 = *(byte *)((long)chip + 0x70);
          do {
            fVar19 = fVar19 + (float)(iVar12 + (uint)*(byte *)((long)chip + 0x5a) + 1);
            bVar15 = bVar6 + 1;
            bVar6 = bVar15 & 0x1f;
          } while (fVar19 < 0.0);
          bVar9 = bVar15 & 0xf ^ 7;
          if ((bVar15 & 8) == 0) {
            bVar9 = bVar15 & 0xf | 8;
          }
          bVar11 = bVar9 * '\x02' ^ 0x1e;
          if ((bVar15 & 0x10) == 0) {
            bVar11 = bVar9 * '\x02';
          }
          cVar10 = bVar11 - 0x10;
          *(float *)((long)chip + 0x6c) = fVar19;
          *(byte *)((long)chip + 0x70) = bVar6;
          goto LAB_00161797;
        }
      }
      else {
        cVar10 = '\0';
LAB_00161797:
        *(char *)((long)chip + 0x73) = cVar10;
      }
      if ((*(char *)((long)chip + 0x95) == '\x01') && (*(char *)((long)chip + 0x97) == '\0')) {
        bVar6 = *(byte *)((long)chip + 0x80);
        uVar7 = bVar6 & 0xf;
        iVar12 = *(int *)((long)chip + (ulong)uVar7 * 4 + 0x188);
        fVar19 = *(float *)((long)chip + 0x90) + -4.0;
        *(float *)((long)chip + 0x90) = fVar19;
        if (fVar19 < 0.0) {
          bVar15 = *(byte *)((long)chip + 0x94);
          do {
            if ((bVar6 & 0x20) == 0) {
              if (bVar15 < 0xf) {
                bVar15 = bVar15 + 1;
                goto LAB_0016180f;
              }
            }
            else {
              bVar15 = bVar15 + 1 & 0xf;
LAB_0016180f:
              *(byte *)((long)chip + 0x94) = bVar15;
            }
            fVar19 = fVar19 + (float)iVar12;
          } while (fVar19 < 0.0);
          *(float *)((long)chip + 0x90) = fVar19;
        }
        iVar12 = *(int *)((long)chip + 0x88);
        if (0 < iVar12 && (bVar6 & 0x20) == 0) {
          iVar12 = iVar12 + -1;
          *(int *)((long)chip + 0x88) = iVar12;
        }
        if (iVar12 == 0) goto LAB_0016190c;
        fVar19 = *(float *)((long)chip + 0x8c) - *(float *)((long)chip + 0xfc);
        iVar12 = noise_freq[*(byte *)((long)chip + 0xf8)][*(byte *)((long)chip + 0x82) & 0xf];
        *(float *)((long)chip + 0x8c) = fVar19;
        if (fVar19 < 0.0) {
          uVar16 = (uint)*(ushort *)((long)chip + 0x84);
          sVar8 = ((char)*(byte *)((long)chip + 0x82) < '\0') * '\x05' + 1;
          if (*(char *)((long)chip + 0xfa) != '\0') {
            sVar8 = 1;
          }
          do {
            fVar19 = fVar19 + (float)iVar12;
            uVar16 = (((uVar16 >> sVar8 ^ uVar16) & 1) << 0xf | uVar16) >> 1;
          } while (fVar19 < 0.0);
          *(short *)((long)chip + 0x84) = (short)uVar16;
          *(float *)((long)chip + 0x8c) = fVar19;
        }
        if ((bVar6 & 0x10) == 0) {
          uVar7 = (uint)(byte)(0xf - *(char *)((long)chip + 0x94));
        }
        bVar6 = -(byte)uVar7;
        if ((*(byte *)((long)chip + 0x84) & 1) != 0) {
          bVar6 = (byte)uVar7;
        }
      }
      else {
LAB_0016190c:
        bVar6 = 0;
      }
      *(byte *)((long)chip + 0x96) = bVar6;
      if (*(char *)((long)chip + 0xc3) == '\0') {
        if (*(char *)((long)chip + 0xb5) == '\x01') {
          uVar7 = *(uint *)((long)chip + 0xa0);
          fVar19 = *(float *)((long)chip + 0xb0) - *(float *)((long)chip + 0xfc);
          iVar12 = dpcm_clocks[*(byte *)((long)chip + 0xf8)][uVar7 & 0xf];
          *(float *)((long)chip + 0xb0) = fVar19;
          if (fVar19 < 0.0) {
            iVar13 = *(int *)((long)chip + 0xa8);
            do {
              fVar19 = fVar19 + (float)iVar12;
              *(float *)((long)chip + 0xb0) = fVar19;
              if (iVar13 == 0) {
                *(undefined1 *)((long)chip + 0xb5) = 0;
                if ((uVar7 & 0x40) == 0) {
                  if ((char)uVar7 < '\0') {
                    *(undefined1 *)((long)chip + 0xb6) = 1;
                  }
                  break;
                }
                *(uint *)((long)chip + 0xa4) = (uint)*(byte *)((long)chip + 0xa2) << 6 | 0xc000;
                iVar13 = (uint)*(byte *)((long)chip + 0xa3) * 0x10 + 1;
                *(int *)((long)chip + 0xa8) = iVar13;
                iVar17 = (uint)*(byte *)((long)chip + 0xa3) * 0x80 + 8;
                *(undefined2 *)((long)chip + 0xb5) = 1;
              }
              else {
                iVar17 = *(int *)((long)chip + 0xac);
              }
              *(uint *)((long)chip + 0xac) = iVar17 - 1U;
              uVar16 = iVar17 - 1U & 7;
              if (uVar16 == 0) {
                uVar1 = *(uint *)((long)chip + 0xa4);
                bVar15 = *(byte *)(*(long *)((long)chip + 0xb8) + (ulong)uVar1);
                uVar4 = uVar1 - 0x7fff;
                if (uVar1 + 1 < 0x10000) {
                  uVar4 = uVar1 + 1;
                }
                *(byte *)((long)chip + 0xb4) = bVar15;
                *(uint *)((long)chip + 0xa4) = uVar4;
                iVar13 = iVar13 + -1;
                *(int *)((long)chip + 0xa8) = iVar13;
              }
              else {
                bVar15 = *(byte *)((long)chip + 0xb4);
              }
              sVar18 = 2;
              if (((bVar15 >> (uVar16 ^ 7) & 1) != 0) ||
                 (sVar18 = -2, 1 < *(short *)((long)chip + 0xc0))) {
                *(short *)((long)chip + 0xc0) = sVar18 + *(short *)((long)chip + 0xc0);
              }
            } while (fVar19 < 0.0);
          }
        }
        sVar18 = *(short *)((long)chip + 0xc0);
        sVar5 = 0x7f;
        if (sVar18 < 0x80) {
          if (-1 < sVar18) goto LAB_00161a8d;
          sVar5 = 0;
        }
        sVar18 = sVar5;
        *(short *)((long)chip + 0xc0) = sVar18;
      }
      else {
        sVar18 = 0;
      }
LAB_00161a8d:
      bVar9 = (byte)sVar18;
      *(byte *)((long)chip + 0xc2) = bVar9;
      bVar15 = *(byte *)((long)chip + 0x23);
      if (*(char *)((long)chip + 0xf9) == '\0') {
        bVar11 = *(byte *)((long)chip + 0x4b);
        cVar10 = *(char *)((long)chip + 0x73);
        pDVar2[uVar14] = *(int *)((long)chip + 0x28) * (int)(short)((ushort)bVar15 << 8) >> 0x10;
        pDVar3[uVar14] = (int)(short)((ushort)bVar15 << 8) * *(int *)((long)chip + 0x2c) >> 0x10;
        iVar12 = (int)(short)((ushort)bVar11 << 8);
        pDVar2[uVar14] = pDVar2[uVar14] + (*(int *)((long)chip + 0x50) * iVar12 >> 0x10);
        pDVar3[uVar14] = pDVar3[uVar14] + (iVar12 * *(int *)((long)chip + 0x54) >> 0x10);
        iVar12 = cVar10 * 0xc00000 >> 0x10;
        pDVar2[uVar14] = pDVar2[uVar14] + (*(int *)((long)chip + 0x78) * iVar12 >> 0x10);
        pDVar3[uVar14] = pDVar3[uVar14] + (iVar12 * *(int *)((long)chip + 0x7c) >> 0x10);
        iVar12 = (char)bVar6 * 0xc00000 >> 0x10;
        pDVar2[uVar14] = pDVar2[uVar14] + (*(int *)((long)chip + 0x98) * iVar12 >> 0x10);
        pDVar3[uVar14] = pDVar3[uVar14] + (iVar12 * *(int *)((long)chip + 0x9c) >> 0x10);
        pDVar2[uVar14] =
             pDVar2[uVar14] + (int)((long)*(int *)((long)chip + 0xc4) * (ulong)bVar9 * 0xc0 >> 0x10)
        ;
        pDVar3[uVar14] =
             pDVar3[uVar14] + (int)((long)*(int *)((long)chip + 200) * (ulong)bVar9 * 0xc0 >> 0x10);
      }
      else {
        if ((char)bVar15 < '\x01') {
          bVar15 = 0;
        }
        cVar10 = *(char *)((long)chip + 0x4b);
        if (cVar10 < '\x01') {
          cVar10 = '\0';
        }
        uVar7 = (uint)bVar6;
        if ((char)bVar6 < '\x01') {
          uVar7 = 0;
        }
        iVar12 = *(int *)((long)tnd_lut[(short)((uint)(int)(short)((short)*(char *)((long)chip +
                                                                                   0x73) +
                                                                   (short)(((int)*(char *)((long)
                                                  chip + 0x73) + 0x10U & 0xffff) >> 0xf) + 0x10) >>
                                               1)][0] + (ulong)bVar9 * 4 + (ulong)(uVar7 << 9)) +
                 square_lut[(byte)(cVar10 + bVar15)];
        pDVar2[uVar14] = iVar12;
        pDVar3[uVar14] = iVar12;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != samples);
  }
  return;
}

Assistant:

void nes_apu_update(void* chip, UINT32 samples, DEV_SMPL **outputs)
{
	nesapu_state *info = (nesapu_state*)chip;
	apu_t *apu = &info->APU;
	DEV_SMPL* bufL = outputs[0];
	DEV_SMPL* bufR = outputs[1];
	UINT32 i;

	for (i = 0; i < samples; i++)
	{
		INT16 squ1, squ2, tri, noi, dpcm;

		apu_square(info, &apu->squ[0]);
		apu_square(info, &apu->squ[1]);
		apu_triangle(info, &apu->tri);
		apu_noise(info, &apu->noi);
		apu_dpcm(info, &apu->dpcm);

		if (info->nonlinear_mixing)
		{
			squ1 = (apu->squ[0].output >= 0) ? apu->squ[0].output : 0;
			squ2 = (apu->squ[1].output >= 0) ? apu->squ[1].output : 0;
			tri  = (apu->tri.output + 0x10) / 2;
			noi  = (apu->noi.output >= 0) ? apu->noi.output : 0;
			dpcm = apu->dpcm.output;
			bufL[i] = square_lut[squ1 + squ2];
			bufL[i] += tnd_lut[tri][noi][dpcm];
			bufR[i] = bufL[i];
		}
		else
		{
			// These volumes should match NSFPlay's NES core better
			squ1 = apu->squ[0].output * 0x100;	// [-15..+15] << 8 * 1.0
			squ2 = apu->squ[1].output * 0x100;	// [-15..+15] << 8 * 1.0
			tri  = apu->tri.output * 0xC0;	// [-16..+16] << 8 * 0.75
			noi  = apu->noi.output * 0xC0;	// [-15..+15] << 8 * 0.75
			dpcm = apu->dpcm.output * 0xC0;	// [0..+127] << 8 * 0.75

			bufL[i]  = APPLY_PANNING_S(squ1, apu->squ[0].Pan[0]);
			bufR[i]  = APPLY_PANNING_S(squ1, apu->squ[0].Pan[1]);
			bufL[i] += APPLY_PANNING_S(squ2, apu->squ[1].Pan[0]);
			bufR[i] += APPLY_PANNING_S(squ2, apu->squ[1].Pan[1]);
			bufL[i] += APPLY_PANNING_S(tri, apu->tri.Pan[0]);
			bufR[i] += APPLY_PANNING_S(tri, apu->tri.Pan[1]);
			bufL[i] += APPLY_PANNING_S(noi, apu->noi.Pan[0]);
			bufR[i] += APPLY_PANNING_S(noi, apu->noi.Pan[1]);
			bufL[i] += APPLY_PANNING_L(dpcm, apu->dpcm.Pan[0]);	// could be 0..24384, thus use _L macro
			bufR[i] += APPLY_PANNING_L(dpcm, apu->dpcm.Pan[1]);
		}
	}
}